

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall
SQCompiler::EmitCompoundArith(SQCompiler *this,SQInteger tok,SQInteger etype,SQInteger pos)

{
  SQOpcode SVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  ulong uVar4;
  SQInteger arg0;
  SQFuncState *pSVar5;
  
  if (etype - 2U < 2) {
    uVar4 = SQFuncState::PopTarget(this->_fs);
    SVar3 = SQFuncState::PopTarget(this->_fs);
    SVar2 = SQFuncState::PopTarget(this->_fs);
    pSVar5 = this->_fs;
    arg0 = SQFuncState::PushTarget(pSVar5,-1);
    pos = SVar2 << 0x10 | uVar4;
    SVar2 = ChooseCompArithCharByToken(this,tok);
    SVar1 = _OP_COMPARITH;
  }
  else {
    if (etype != 5) {
      if (etype == 4) {
        SVar2 = SQFuncState::PopTarget(this->_fs);
        SVar3 = SQFuncState::PopTarget(this->_fs);
        SQFuncState::PushTarget(this->_fs,SVar3);
        pSVar5 = this->_fs;
        SVar1 = ChooseArithOpByToken(this,tok);
        SQFuncState::AddInstruction(pSVar5,SVar1,SVar3,SVar2,SVar3,0);
        this->_fs->_optimization = false;
      }
      return;
    }
    SVar2 = SQFuncState::TopTarget(this->_fs);
    SVar3 = SQFuncState::PushTarget(this->_fs,-1);
    SQFuncState::AddInstruction(this->_fs,_OP_GETOUTER,SVar3,pos,0,0);
    pSVar5 = this->_fs;
    SVar1 = ChooseArithOpByToken(this,tok);
    SQFuncState::AddInstruction(pSVar5,SVar1,SVar3,SVar2,SVar3,0);
    SQFuncState::PopTarget(this->_fs);
    SQFuncState::PopTarget(this->_fs);
    pSVar5 = this->_fs;
    arg0 = SQFuncState::PushTarget(pSVar5,-1);
    SVar1 = _OP_SETOUTER;
    SVar2 = 0;
  }
  SQFuncState::AddInstruction(pSVar5,SVar1,arg0,pos,SVar3,SVar2);
  return;
}

Assistant:

void EmitCompoundArith(SQInteger tok, SQInteger etype, SQInteger pos)
    {
        /* Generate code depending on the expression type */
        switch(etype) {
        case LOCAL:{
            SQInteger p2 = _fs->PopTarget(); //src in OP_GET
            SQInteger p1 = _fs->PopTarget(); //key in OP_GET
            _fs->PushTarget(p1);
            //EmitCompArithLocal(tok, p1, p1, p2);
            _fs->AddInstruction(ChooseArithOpByToken(tok),p1, p2, p1, 0);
            _fs->SnoozeOpt();
                   }
            break;
        case OBJECT:
        case BASE:
            {
                SQInteger val = _fs->PopTarget();
                SQInteger key = _fs->PopTarget();
                SQInteger src = _fs->PopTarget();
                /* _OP_COMPARITH mixes dest obj and source val in the arg1 */
                _fs->AddInstruction(_OP_COMPARITH, _fs->PushTarget(), (src<<16)|val, key, ChooseCompArithCharByToken(tok));
            }
            break;
        case OUTER:
            {
                SQInteger val = _fs->TopTarget();
                SQInteger tmp = _fs->PushTarget();
                _fs->AddInstruction(_OP_GETOUTER,   tmp, pos);
                _fs->AddInstruction(ChooseArithOpByToken(tok), tmp, val, tmp, 0);
                _fs->PopTarget();
                _fs->PopTarget();
                _fs->AddInstruction(_OP_SETOUTER, _fs->PushTarget(), pos, tmp);
            }
            break;
        }
    }